

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_database_size.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::PragmaDatabaseSizeBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [14])"database_name");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [14])0x1dde2ca);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [11])0x1df10ad);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"total_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"used_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"free_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])"wal_size");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"memory_usage");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"memory_limit");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> PragmaDatabaseSizeBind(ClientContext &context, TableFunctionBindInput &input,
                                                       vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("database_name");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("database_size");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("block_size");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("total_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("used_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("free_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("wal_size");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("memory_usage");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("memory_limit");
	return_types.emplace_back(LogicalType::VARCHAR);

	return nullptr;
}